

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.h
# Opt level: O3

int __thiscall crnlib::dxt_image::pack_params::init(pack_params *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  undefined8 uVar2;
  byte bVar3;
  
  uVar1 = *(uint *)(ctx + 0x20);
  bVar3 = (byte)uVar1;
  this->m_perceptual = (bool)(bVar3 & 1);
  this->m_num_helper_threads = *(uint *)(ctx + 0x358);
  this->m_use_both_block_types = (bool)(bVar3 >> 3 & 1);
  this->m_use_transparent_indices_for_black = (bool)(bVar3 >> 4 & 1);
  this->m_dxt1a_alpha_threshold = *(uint *)(ctx + 0x330);
  this->m_endpoint_caching = (uVar1 & 0x20) == 0;
  this->m_grayscale_sampling = (bool)((byte)(uVar1 >> 8) & 1);
  uVar2 = *(undefined8 *)(ctx + 0x334);
  this->m_quality = (int)uVar2;
  this->m_compressor = (int)((ulong)uVar2 >> 0x20);
  return (int)uVar2;
}

Assistant:

void init(const crn_comp_params& params)
            {
                m_perceptual = (params.m_flags & cCRNCompFlagPerceptual) != 0;
                m_num_helper_threads = params.m_num_helper_threads;
                m_use_both_block_types = (params.m_flags & cCRNCompFlagUseBothBlockTypes) != 0;
                m_use_transparent_indices_for_black = (params.m_flags & cCRNCompFlagUseTransparentIndicesForBlack) != 0;
                m_dxt1a_alpha_threshold = params.m_dxt1a_alpha_threshold;
                m_quality = params.m_dxt_quality;
                m_endpoint_caching = (params.m_flags & cCRNCompFlagDisableEndpointCaching) == 0;
                m_grayscale_sampling = (params.m_flags & cCRNCompFlagGrayscaleSampling) != 0;
                m_compressor = params.m_dxt_compressor_type;
            }